

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::find_or_prepare_insert_soo<int>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *this,int *key)

{
  bool bVar1;
  long *key_1;
  slot_type *psVar2;
  size_t i;
  ulong uVar3;
  iterator iVar4;
  
  bVar1 = empty(this);
  if (bVar1) {
    try_sample_soo(this);
    CommonFields::set_full_soo((CommonFields *)this);
    iVar4 = soo_iterator(this);
  }
  else {
    psVar2 = soo_slot(this);
    if (*psVar2 == (long)*key) {
      iVar4 = soo_iterator(this);
      bVar1 = false;
      goto LAB_00171015;
    }
    resize_impl(this,3);
    uVar3 = ((long)*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
    i = PrepareInsertAfterSoo
                  (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38,8,(CommonFields *)this);
    iVar4 = iterator_at(this,i);
  }
  bVar1 = true;
LAB_00171015:
  __return_storage_ptr__->first = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }